

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::FileOptions::ByteSizeLong(FileOptions *this)

{
  uint uVar1;
  size_t sVar2;
  UnknownFieldSet *unknown_fields;
  size_t sVar3;
  Type *value;
  size_t sVar4;
  uint i;
  uint index;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  sVar2 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) != 0) {
    unknown_fields = FileOptions::unknown_fields(this);
    sVar3 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  sVar2 = sVar2 + (ulong)uVar1 * 2;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>::TypeHandler>
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,index);
    sVar3 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::UninterpretedOption>
                      (value);
    sVar2 = sVar2 + sVar3;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->java_package_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->java_outer_classname_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->go_package_).ptr_);
      sVar2 = sVar2 + sVar3 + 1;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 8) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->objc_class_prefix_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x10) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->csharp_namespace_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x20) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->swift_prefix_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    if ((uVar1 & 0x40) != 0) {
      sVar3 = internal::WireFormatLite::StringSize((this->php_class_prefix_).ptr_);
      sVar2 = sVar2 + sVar3 + 2;
      uVar1 = (this->_has_bits_).has_bits_[0];
    }
    sVar2 = sVar2 + (uVar1 >> 6 & 2);
  }
  if ((uVar1 & 0xff00) != 0) {
    auVar6._0_4_ = -(uint)((uVar1 & 0x800) == 0);
    auVar6._4_4_ = -(uint)((uVar1 & 0x400) == 0);
    auVar6._8_4_ = -(uint)((uVar1 & 0x200) == 0);
    auVar6._12_4_ = -(uint)((uVar1 & 0x100) == 0);
    auVar5._0_4_ = -(uint)((uVar1 & 0x8000) == 0);
    auVar5._4_4_ = -(uint)((uVar1 & 0x4000) == 0);
    auVar5._8_4_ = -(uint)((uVar1 & 0x2000) == 0);
    auVar5._12_4_ = -(uint)((uVar1 & 0x1000) == 0);
    auVar6 = packssdw(auVar5,auVar6);
    auVar6 = packsswb(auVar6,auVar6);
    sVar3 = sVar2 + 3;
    if ((auVar6 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar3 = sVar2;
    }
    sVar2 = sVar3 + 3;
    if ((auVar6 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar2 = sVar3;
    }
    sVar3 = sVar2 + 3;
    if ((auVar6 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar3 = sVar2;
    }
    sVar2 = sVar3 + 3;
    if ((auVar6 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar2 = sVar3;
    }
    sVar3 = sVar2 + 3;
    if ((auVar6 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar3 = sVar2;
    }
    sVar4 = sVar3 + 3;
    if ((auVar6 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar4 = sVar3;
    }
    sVar2 = sVar4 + 3;
    if ((auVar6 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      sVar2 = sVar4;
    }
    if ((auVar6 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      sVar3 = io::CodedOutputStream::VarintSize32SignExtended(this->optimize_for_);
      sVar2 = sVar2 + sVar3 + 1;
    }
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t FileOptions::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FileOptions)
  size_t total_size = 0;

  total_size += _extensions_.ByteSize();

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  {
    unsigned int count = this->uninterpreted_option_size();
    total_size += 2UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->uninterpreted_option(i));
    }
  }

  if (_has_bits_[0 / 32] & 255u) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional string objc_class_prefix = 36;
    if (has_objc_class_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->objc_class_prefix());
    }

    // optional string csharp_namespace = 37;
    if (has_csharp_namespace()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->csharp_namespace());
    }

    // optional string swift_prefix = 39;
    if (has_swift_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->swift_prefix());
    }

    // optional string php_class_prefix = 40;
    if (has_php_class_prefix()) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->php_class_prefix());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[8 / 32] & 65280u) {
    // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional bool java_string_check_utf8 = 27 [default = false];
    if (has_java_string_check_utf8()) {
      total_size += 2 + 1;
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool deprecated = 23 [default = false];
    if (has_deprecated()) {
      total_size += 2 + 1;
    }

    // optional bool cc_enable_arenas = 31 [default = false];
    if (has_cc_enable_arenas()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}